

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbor.cpp
# Opt level: O2

Error * __thiscall
ot::commissioner::CborMap::Put(Error *__return_storage_ptr__,CborMap *this,int aKey,CborMap *aMap)

{
  _Bool _Var1;
  char *begin;
  char *pcVar2;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
  in_R9;
  format_args args;
  string sStack_68;
  format_string_checker<char> local_48;
  
  (aMap->super_CborValue).mIsRoot = false;
  _Var1 = cn_cbor_mapput_int((this->super_CborValue).mCbor,(long)aKey,(aMap->super_CborValue).mCbor,
                             (cn_cbor_errback *)0x0);
  if (_Var1) {
    __return_storage_ptr__->mCode = kNone;
    (__return_storage_ptr__->mMessage)._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->mMessage).field_2;
    (__return_storage_ptr__->mMessage)._M_string_length = 0;
    (__return_storage_ptr__->mMessage).field_2._M_local_buf[0] = '\0';
  }
  else {
    local_48.types_[0] = none_type;
    local_48.context_.super_basic_format_parse_context<char>.format_str_.data_ =
         "CBOR map insert map";
    local_48.context_.super_basic_format_parse_context<char>.format_str_.size_ = 0x13;
    local_48.context_.super_basic_format_parse_context<char>.next_arg_id_ = 0;
    local_48.context_.super_basic_format_parse_context<char>._20_4_ = 0;
    local_48.parse_funcs_[0] = (parse_func)0x0;
    pcVar2 = "CBOR map insert map";
    local_48.context_.types_ = local_48.types_;
    while (begin = pcVar2, begin != "") {
      pcVar2 = begin + 1;
      if (*begin == '}') {
        if ((pcVar2 == "") || (*pcVar2 != '}')) {
          ::fmt::v10::detail::throw_format_error("unmatched \'}\' in format string");
        }
        pcVar2 = begin + 2;
      }
      else if (*begin == '{') {
        pcVar2 = ::fmt::v10::detail::
                 parse_replacement_field<char,fmt::v10::detail::format_string_checker<char>&>
                           (begin,"",&local_48);
      }
    }
    args.field_1.args_ = in_R9.args_;
    args.desc_ = (unsigned_long_long)&local_48;
    ::fmt::v10::vformat_abi_cxx11_
              (&sStack_68,(v10 *)"CBOR map insert map",(string_view)ZEXT816(0x13),args);
    __return_storage_ptr__->mCode = kOutOfMemory;
    std::__cxx11::string::string((string *)&__return_storage_ptr__->mMessage,(string *)&sStack_68);
    std::__cxx11::string::~string((string *)&sStack_68);
  }
  return __return_storage_ptr__;
}

Assistant:

Error CborMap::Put(int aKey, const CborMap &aMap)
{
    aMap.mIsRoot = false;
    return cn_cbor_mapput_int(mCbor, aKey, aMap.mCbor, nullptr) ? ERROR_NONE
                                                                : ERROR_OUT_OF_MEMORY("CBOR map insert map");
}